

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O2

QByteArray * __thiscall
QDtlsPrivateOpenSSL::decryptDatagram
          (QByteArray *__return_storage_ptr__,QDtlsPrivateOpenSSL *this,QUdpSocket *socket,
          QByteArray *tlsdgram)

{
  QDtlsBasePrivate *pQVar1;
  SSL *a;
  int iVar2;
  uint uVar3;
  char *b;
  unsigned_long uVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::operator=(&(this->dtls).dgram,tlsdgram);
  (this->dtls).udpSocket = socket;
  pQVar1 = &this->super_QDtlsBasePrivate;
  (**(code **)(*(long *)&this->super_QDtlsBasePrivate + 0x28))(pQVar1);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QByteArray::resize((longlong)__return_storage_ptr__);
  a = (this->dtls).tlsConnection.value.ptr;
  b = QByteArray::data(__return_storage_ptr__);
  iVar2 = q_SSL_read(a,b,(int)(__return_storage_ptr__->d).size);
  if (0 < iVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QByteArray::resize((longlong)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    goto LAB_00136f92;
  }
  QByteArray::clear();
  uVar4 = q_ERR_get_error();
  if (1 < uVar4 - 2) {
    if (uVar4 == 6) {
LAB_00136eb3:
      this->connectionWasShutdown = true;
      QDtls::tr((QString *)&local_48,"The DTLS connection has been shutdown",(char *)0x0,-1);
      (**(code **)(*(long *)&this->super_QDtlsBasePrivate + 0x10))(pQVar1,4,&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      dtlsopenssl::DtlsState::reset(&this->dtls);
      this->connectionEncrypted = false;
      this->handshakeState = HandshakeNotStarted;
    }
    else if (uVar4 == 0) {
      uVar3 = q_SSL_get_shutdown((this->dtls).tlsConnection.value.ptr);
      if ((uVar3 & 2) != 0) goto LAB_00136eb3;
    }
    else {
      QDtls::tr((QString *)&local_60,"Error while reading: %1",(char *)0x0,-1);
      QTlsBackendOpenSSL::getErrorsFromOpenSsl();
      QString::arg<QString,_true>
                ((QString *)&local_48,(QString *)&local_60,(QString *)&QStack_78,0,(QChar)0x20);
      (**(code **)(*(long *)pQVar1 + 0x10))(pQVar1,8,&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_00136f92:
  __stack_chk_fail();
}

Assistant:

QByteArray QDtlsPrivateOpenSSL::decryptDatagram(QUdpSocket *socket, const QByteArray &tlsdgram)
{
    Q_ASSERT(socket);
    Q_ASSERT(tlsdgram.size());

    Q_ASSERT(dtls.tlsConnection.data());
    Q_ASSERT(connectionEncrypted);

    dtls.dgram = tlsdgram;
    dtls.udpSocket = socket;

    clearDtlsError();

    QByteArray dgram;
    dgram.resize(tlsdgram.size());
    const int read = q_SSL_read(dtls.tlsConnection.data(), dgram.data(),
                                dgram.size());

    if (read > 0) {
        dgram.resize(read);
        return dgram;
    }

    dgram.clear();
    unsigned long errorCode = q_ERR_get_error();
    if (errorCode == SSL_ERROR_NONE) {
        const int shutdown = q_SSL_get_shutdown(dtls.tlsConnection.data());
        if (shutdown & SSL_RECEIVED_SHUTDOWN)
            errorCode = SSL_ERROR_ZERO_RETURN;
        else
            return dgram;
    }

    switch (errorCode) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
        return dgram;
    case SSL_ERROR_ZERO_RETURN:
        // "The connection was shut down cleanly" ... hmm, whatever,
        // needs testing (DTLSTODO).
        connectionWasShutdown = true;
        setDtlsError(QDtlsError::RemoteClosedConnectionError,
                     QDtls::tr("The DTLS connection has been shutdown"));
        dtls.reset();
        connectionEncrypted = false;
        handshakeState = QDtls::HandshakeNotStarted;
        return dgram;
    case SSL_ERROR_SYSCALL: // some IO error
    case SSL_ERROR_SSL:     // error in the SSL library
        // DTLSTODO: Apparently, some errors can be ignored, for example,
        // ECONNRESET etc. This all needs a lot of testing!!!
    default:
        setDtlsError(QDtlsError::TlsNonFatalError,
                     QDtls::tr("Error while reading: %1")
                               .arg(QTlsBackendOpenSSL::getErrorsFromOpenSsl()));
        return dgram;
    }
}